

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

void __thiscall
bgui::ImageAdapter<unsigned_short>::adaptMinMaxIntensity
          (ImageAdapter<unsigned_short> *this,long x,long y,long w,long h)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *pIVar5;
  unsigned_short *puVar6;
  bool bVar7;
  long lVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  long local_68 [7];
  
  dVar1 = (this->super_ImageAdapterBase).scale;
  local_68[0] = (long)((double)x / dVar1);
  local_68[1] = (long)((double)y / dVar1);
  local_68[2] = 1;
  lVar8 = 0;
  local_68[6] = 0;
  local_68[5] = 0;
  plVar9 = local_68 + 6;
  bVar16 = true;
  do {
    bVar7 = bVar16;
    lVar12 = *plVar9;
    lVar13 = 0;
    do {
      lVar12 = lVar12 + local_68[lVar13] * (this->super_ImageAdapterBase).R.v[lVar8][lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    *plVar9 = lVar12;
    lVar8 = 1;
    plVar9 = local_68 + 5;
    bVar16 = false;
  } while (bVar7);
  local_68[0] = (long)((double)(w + x + -1) / dVar1);
  local_68[1] = (long)((double)(y + -1 + h) / dVar1);
  local_68[2] = 1;
  lVar8 = 0;
  local_68[4] = 0;
  local_68[3] = 0;
  plVar9 = local_68 + 4;
  bVar16 = true;
  do {
    bVar7 = bVar16;
    lVar12 = *plVar9;
    lVar13 = 0;
    do {
      lVar12 = lVar12 + local_68[lVar13] * (this->super_ImageAdapterBase).R.v[lVar8][lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    *plVar9 = lVar12;
    lVar8 = 1;
    plVar9 = local_68 + 3;
    bVar16 = false;
  } while (bVar7);
  lVar8 = local_68[6];
  if (local_68[4] < local_68[6]) {
    lVar8 = local_68[4];
  }
  lVar12 = local_68[5];
  if (local_68[3] < local_68[5]) {
    lVar12 = local_68[3];
  }
  if (lVar8 < 1) {
    lVar8 = 0;
  }
  pIVar5 = this->image;
  lVar13 = pIVar5->width;
  lVar14 = pIVar5->height;
  if (lVar12 < 1) {
    lVar12 = 0;
  }
  dVar1 = this->vmax;
  (this->super_ImageAdapterBase).imin = dVar1;
  dVar2 = this->vmin;
  (this->super_ImageAdapterBase).imax = dVar2;
  iVar3 = pIVar5->depth;
  iVar4 = (this->super_ImageAdapterBase).channel;
  iVar11 = 0;
  if (-1 < iVar4 && iVar4 < iVar3) {
    iVar11 = iVar4;
  }
  iVar10 = iVar3 + -1;
  if (-1 < iVar4 && iVar4 < iVar3) {
    iVar10 = iVar4;
  }
  dVar17 = dVar1;
  dVar18 = dVar2;
  if (iVar11 <= iVar10) {
    lVar14 = lVar14 + -1;
    if (local_68[3] < local_68[5]) {
      local_68[3] = local_68[5];
    }
    if (lVar14 < local_68[3]) {
      local_68[3] = lVar14;
    }
    lVar13 = lVar13 + -1;
    if (local_68[4] < local_68[6]) {
      local_68[4] = local_68[6];
    }
    if (lVar13 < local_68[4]) {
      local_68[4] = lVar13;
    }
    lVar13 = (long)iVar11;
    do {
      lVar14 = lVar12;
      dVar19 = dVar17;
      if (lVar12 <= local_68[3]) {
        do {
          if (lVar8 <= local_68[4]) {
            puVar6 = pIVar5->img[lVar13][lVar14];
            lVar15 = lVar8;
            do {
              dVar20 = (double)puVar6[lVar15];
              if ((dVar2 <= dVar20) && (dVar20 <= dVar1)) {
                dVar17 = dVar20;
                if (dVar19 <= dVar20) {
                  dVar17 = dVar19;
                }
                (this->super_ImageAdapterBase).imin = dVar17;
                if (dVar20 <= dVar18) {
                  dVar20 = dVar18;
                }
                dVar18 = dVar20;
                (this->super_ImageAdapterBase).imax = dVar18;
                dVar19 = dVar17;
              }
              lVar15 = lVar15 + 1;
            } while (local_68[4] + 1 != lVar15);
          }
          bVar16 = lVar14 != local_68[3];
          lVar14 = lVar14 + 1;
        } while (bVar16);
      }
      lVar13 = lVar13 + 1;
    } while (iVar10 + 1 != (int)lVar13);
  }
  if (dVar18 <= dVar17) {
    (this->super_ImageAdapterBase).imin = 0.0;
    (this->super_ImageAdapterBase).imax = 1.0;
  }
  return;
}

Assistant:

void adaptMinMaxIntensity(long x, long y, long w, long h)
    {
      // compute original area

      const gmath::SVector<long, 2> p1=R*gmath::SVector<long, 3>(static_cast<long>(x/scale),
                                       static_cast<long>(y/scale), 1);
      const gmath::SVector<long, 2> p2=R*gmath::SVector<long, 3>(static_cast<long>((x+w-1)/scale),
                                       static_cast<long>((y+h-1)/scale), 1);

      long xmin=std::min(p1[0], p2[0]), xmax=std::max(p1[0], p2[0]);
      long ymin=std::min(p1[1], p2[1]), ymax=std::max(p1[1], p2[1]);

      xmin=std::max(xmin, 0l);
      xmax=std::min(xmax, image->getWidth()-1);
      ymin=std::max(ymin, 0l);
      ymax=std::min(ymax, image->getHeight()-1);

      // search minimum and maximum valid intensity in the specified area

      imin=vmax;
      imax=vmin;

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        for (long y=ymin; y<=ymax; y++)
        {
          for (long x=xmin; x<=xmax; x++)
          {
            double v=image->get(x, y, d);

            if (v >= vmin && v <= vmax)
            {
              imin=std::min(imin, v);
              imax=std::max(imax, v);
            }
          }
        }
      }

      if (imax <= imin)
      {
        imin=0;
        imax=1;
      }
    }